

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

Time __thiscall helics::apps::Player::extractTime(Player *this,string_view str,int lineNumber)

{
  string_view str_00;
  long in_RDI;
  invalid_argument *anon_var_0;
  size_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  time_units in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  time_units in_stack_ffffffffffffff5c;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  allocator<char> *in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_49 [65];
  baseType local_8;
  
  if (*(int *)(in_RDI + 0x260) == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    CLI::std::__cxx11::stoll
              ((string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,0);
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              (in_stack_ffffffffffffff60,
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff54);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    std::allocator<char>::~allocator(local_49);
  }
  else {
    str_00._M_str = in_stack_ffffffffffffff68;
    str_00._M_len = (size_t)in_stack_ffffffffffffff60;
    local_8 = (baseType)loadTimeFromString(str_00,in_stack_ffffffffffffff5c);
  }
  return (Time)local_8;
}

Assistant:

helics::Time Player::extractTime(std::string_view str, int lineNumber) const
{
    try {
        if (units == time_units::ns)  // ns
        {
            return {std::stoll(std::string(str)), time_units::ns};
        }
        return loadTimeFromString(str, units);
    }
    catch (const std::invalid_argument&) {
        std::cerr << "ill formed time on line " << lineNumber << '\n';
        return helics::Time::minVal();
    }
}